

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccpath.cpp
# Opt level: O2

CCDir * gnuc64(void)

{
  CCDir *in_RDI;
  
  CCDir::CCDir(in_RDI);
  std::__cxx11::string::assign((char *)in_RDI);
  std::__cxx11::string::assign((char *)&in_RDI->lib64_path);
  std::__cxx11::string::assign((char *)&in_RDI->dll64_path);
  std::__cxx11::string::assign((char *)&in_RDI->compiler_path);
  std::__cxx11::string::assign((char *)&in_RDI->compiler_name);
  return in_RDI;
}

Assistant:

CCDir gnuc64() {
    CCDir dir;
    dir.include_path="/usr/include/";
    dir.lib64_path="/usr/lib/x86_64-linux-gnu/";
    dir.dll64_path="/usr/lib/x86_64-linux-gnu/";
    dir.compiler_path="/usr/";
    dir.compiler_name = "gnuc";
    return dir;
}